

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwhatsthis.cpp
# Opt level: O1

void __thiscall QWhatsThat::mouseMoveEvent(QWhatsThat *this,QMouseEvent *e)

{
  CursorShape CVar1;
  long in_FS_OFFSET;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  QCursor local_58;
  double dStack_50;
  QPointF local_48;
  undefined1 *local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->doc != (QTextDocument *)0x0) {
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    local_48.xp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
    local_48.yp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
    QTextDocument::documentLayout();
    auVar3 = QEventPoint::position();
    auVar2._0_8_ = (double)((ulong)auVar3._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
                   auVar3._0_8_;
    auVar2._8_8_ = (double)((ulong)auVar3._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
                   auVar3._8_8_;
    auVar2 = minpd(_DAT_0066f5d0,auVar2);
    auVar2 = maxpd(auVar2,_DAT_0066f5e0);
    local_58.d = (QCursorData *)(double)((int)auVar2._0_8_ + -0xc);
    dStack_50 = (double)((int)auVar2._8_8_ + -8);
    QAbstractTextDocumentLayout::anchorAt(&local_48);
    if (local_38 == (undefined1 *)0x0) {
      CVar1 = ArrowCursor;
    }
    else {
      CVar1 = PointingHandCursor;
    }
    QCursor::QCursor(&local_58,CVar1);
    QWidget::setCursor(&this->super_QWidget,&local_58);
    QCursor::~QCursor(&local_58);
    if ((QArrayData *)local_48.xp != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_48.xp)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_48.xp)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_48.xp)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_48.xp,2,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWhatsThat::mouseMoveEvent(QMouseEvent* e)
{
#ifdef QT_NO_CURSOR
    Q_UNUSED(e);
#else
    if (!doc)
        return;
    QString a = doc->documentLayout()->anchorAt(e->position().toPoint() -  QPoint(hMargin, vMargin));
    if (!a.isEmpty())
        setCursor(Qt::PointingHandCursor);
    else
        setCursor(Qt::ArrowCursor);
#endif
}